

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall
TTD::SnapShot::EmitSnapshot(SnapShot *this,int64 snapId,ThreadContext *threadContext)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 local_c0 [8];
  TextFormatWriter snapwriter;
  JsTTDStreamHandle snapHandle;
  TTDataIOInfo *iofp;
  char asciiResourceName [64];
  ThreadContext *threadContext_local;
  int64 snapId_local;
  SnapShot *this_local;
  
  sprintf_s((char *)&iofp,0x40,"snap_%I64i.snp",snapId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar4 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar5 = strlen((char *)&iofp);
  snapwriter._64_8_ = (*p_Var2)(sVar3,pcVar4,sVar5,(char *)&iofp,false,true);
  if ((JsTTDStreamHandle)snapwriter._64_8_ == (JsTTDStreamHandle)0x0) {
    TTDAbort_unrecoverable_error("Failed to open snapshot resource stream for writing.");
  }
  TextFormatWriter::TextFormatWriter
            ((TextFormatWriter *)local_c0,(JsTTDStreamHandle)snapwriter._64_8_,
             (pTVar1->TTDataIOInfo).pfWriteBytesToStream,
             (pTVar1->TTDataIOInfo).pfFlushAndCloseStream);
  EmitSnapshotToFile(this,(FileWriter *)local_c0,threadContext);
  FileWriter::FlushAndClose((FileWriter *)local_c0);
  TextFormatWriter::~TextFormatWriter((TextFormatWriter *)local_c0);
  return;
}

Assistant:

void SnapShot::EmitSnapshot(int64 snapId, ThreadContext* threadContext) const
    {
        char asciiResourceName[64];
        sprintf_s(asciiResourceName, 64, "snap_%I64i.snp", snapId);

        TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
        JsTTDStreamHandle snapHandle = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, false, true);
        TTDAssert(snapHandle != nullptr, "Failed to open snapshot resource stream for writing.");

        TTD_SNAP_WRITER snapwriter(snapHandle, iofp.pfWriteBytesToStream, iofp.pfFlushAndCloseStream);

        this->EmitSnapshotToFile(&snapwriter, threadContext);
        snapwriter.FlushAndClose();
    }